

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void Omega_h::copy_into<long>(Read<signed_char> *a,Write<long> *b)

{
  Alloc *pAVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ScopedTimer omega_h_scoped_function_timer;
  type f;
  ScopedTimer local_92;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
             ,&local_91);
  std::operator+(&local_30,&local_50,":");
  std::__cxx11::to_string(&local_70,0x152);
  std::operator+(&local_90,&local_30,&local_70);
  begin_code("copy_into",local_90._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  pAVar1 = (b->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  if ((int)(uVar2 >> 3) == (int)(uVar3 >> 3)) {
    Write<long>::Write((Write<int> *)&local_90,(Write<int> *)b);
    Write<long>::Write((Write<int> *)&local_90.field_2,(Write<int> *)a);
    pAVar1 = (b->shared_alloc_).alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar4 = pAVar1->size;
    }
    else {
      sVar4 = (ulong)pAVar1 >> 3;
    }
    parallel_for<Omega_h::copy_into<long>(Omega_h::Read<long>,Omega_h::Write<long>)::_lambda(int)_1_>
              ((LO)(sVar4 >> 3),(type *)&local_90,"copy into kernel");
    copy_into<long>(Omega_h::Read<long>,Omega_h::Write<long>)::{lambda(int)#1}::~Write
              ((_lambda_int__1_ *)&local_90);
    ScopedTimer::~ScopedTimer(&local_92);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
       ,0x153);
}

Assistant:

void copy_into(Read<T> a, Write<T> b) {
  OMEGA_H_TIME_FUNCTION;
  OMEGA_H_CHECK(a.size() == b.size());
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = a[i]; };
  parallel_for(b.size(), f, "copy into kernel");
}